

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::FindFileByName
          (SourceTreeDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  bool bVar1;
  byte bVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  Parser parser;
  Tokenizer tokenizer;
  SingleFileErrorCollector file_error_collector;
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  input;
  undefined5 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0d;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  FileDescriptorProto *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  Tokenizer *in_stack_fffffffffffffe30;
  FileDescriptorProto *in_stack_ffffffffffffff28;
  Tokenizer *in_stack_ffffffffffffff30;
  Parser *in_stack_ffffffffffffff38;
  SingleFileErrorCollector local_90;
  string local_58 [32];
  undefined4 local_38;
  undefined8 local_20;
  undefined8 local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  (**(code **)(*(long *)in_RDI->_M_string_length + 0x10))((long *)in_RDI->_M_string_length,in_RSI);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,std::default_delete<google::protobuf::io::ZeroCopyInputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyInputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
              *)in_stack_fffffffffffffe10,
             (pointer)CONCAT17(in_stack_fffffffffffffe0f,
                               CONCAT16(in_stack_fffffffffffffe0e,
                                        CONCAT15(in_stack_fffffffffffffe0d,in_stack_fffffffffffffe08
                                                ))));
  bVar1 = std::operator==((unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                           *)in_stack_fffffffffffffe10,
                          (nullptr_t)
                          CONCAT17(in_stack_fffffffffffffe0f,
                                   CONCAT16(in_stack_fffffffffffffe0e,
                                            CONCAT15(in_stack_fffffffffffffe0d,
                                                     in_stack_fffffffffffffe08))));
  if (bVar1) {
    if (((in_RDI->field_2)._M_allocated_capacity == 0) ||
       (bVar2 = (**(code **)(**(long **)&in_RDI->field_2 + 0x10))
                          (*(long **)&in_RDI->field_2,local_18,local_20), (bVar2 & 1) == 0)) {
      if (*(long *)((long)&in_RDI->field_2 + 8) != 0) {
        in_stack_fffffffffffffe10 = *(FileDescriptorProto **)((long)&in_RDI->field_2 + 8);
        (**(code **)(*(long *)in_RDI->_M_string_length + 0x18))(local_58);
        (*(code *)(((__uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                     *)&(in_stack_fffffffffffffe10->super_Message).super_MessageLite)->_M_t).
                  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>.
                  _M_head_impl[2]._vptr_ZeroCopyInputStream)
                  (in_stack_fffffffffffffe10,local_18,0xffffffff,0,local_58);
        std::__cxx11::string::~string(local_58);
      }
      local_1 = 0;
      local_38 = 1;
    }
    else {
      local_1 = 1;
      local_38 = 1;
    }
  }
  else {
    SingleFileErrorCollector::SingleFileErrorCollector
              ((SingleFileErrorCollector *)in_stack_fffffffffffffe30,in_RDI,
               (MultiFileErrorCollector *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    std::
    unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
    ::get((unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           *)in_stack_fffffffffffffe10);
    io::Tokenizer::Tokenizer
              (in_stack_fffffffffffffe30,(ZeroCopyInputStream *)in_RDI,
               (ErrorCollector *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    Parser::Parser((Parser *)in_stack_fffffffffffffe10);
    if (*(long *)((long)&in_RDI->field_2 + 8) != 0) {
      Parser::RecordErrorsTo((Parser *)&stack0xfffffffffffffe30,&local_90.super_ErrorCollector);
    }
    if (((byte)in_RDI[1]._M_dataplus & 1) != 0) {
      Parser::RecordSourceLocationsTo
                ((Parser *)&stack0xfffffffffffffe30,
                 (SourceLocationTable *)&in_RDI[1]._M_string_length);
    }
    FileDescriptorProto::set_name
              (in_stack_fffffffffffffe10,
               (string *)
               CONCAT17(in_stack_fffffffffffffe0f,
                        CONCAT16(in_stack_fffffffffffffe0e,
                                 CONCAT15(in_stack_fffffffffffffe0d,in_stack_fffffffffffffe08))));
    bVar1 = Parser::Parse(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff28);
    local_1 = 0;
    if (bVar1) {
      bVar1 = SingleFileErrorCollector::had_errors(&local_90);
      local_1 = bVar1 ^ 0xff;
    }
    local_1 = local_1 & 1;
    local_38 = 1;
    Parser::~Parser((Parser *)in_stack_fffffffffffffe10);
    io::Tokenizer::~Tokenizer((Tokenizer *)in_stack_fffffffffffffe10);
    SingleFileErrorCollector::~SingleFileErrorCollector
              ((SingleFileErrorCollector *)in_stack_fffffffffffffe10);
  }
  std::
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                 *)in_stack_fffffffffffffe10);
  return (bool)(local_1 & 1);
}

Assistant:

bool SourceTreeDescriptorDatabase::FindFileByName(const std::string& filename,
                                                  FileDescriptorProto* output) {
  std::unique_ptr<io::ZeroCopyInputStream> input(source_tree_->Open(filename));
  if (input == NULL) {
    if (fallback_database_ != nullptr &&
        fallback_database_->FindFileByName(filename, output)) {
      return true;
    }
    if (error_collector_ != NULL) {
      error_collector_->AddError(filename, -1, 0,
                                 source_tree_->GetLastErrorMessage());
    }
    return false;
  }

  // Set up the tokenizer and parser.
  SingleFileErrorCollector file_error_collector(filename, error_collector_);
  io::Tokenizer tokenizer(input.get(), &file_error_collector);

  Parser parser;
  if (error_collector_ != NULL) {
    parser.RecordErrorsTo(&file_error_collector);
  }
  if (using_validation_error_collector_) {
    parser.RecordSourceLocationsTo(&source_locations_);
  }

  // Parse it.
  output->set_name(filename);
  return parser.Parse(&tokenizer, output) && !file_error_collector.had_errors();
}